

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  char *pcVar4;
  int64_t iVar5;
  ggml_context *pgVar6;
  undefined8 *in_RSI;
  int in_EDI;
  int64_t t_main_end_us;
  int64_t t_start_us;
  int64_t t_quantize_us;
  int64_t t_main_start_us;
  int itype;
  string fname_out;
  string fname_inp;
  ggml_context *ctx;
  ggml_init_params params;
  int in_stack_000006dc;
  string *in_stack_000006e0;
  string *in_stack_000006e8;
  ggml_init_params in_stack_00001808;
  ggml_context *in_stack_fffffffffffffee0;
  allocator<char> *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff18;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_a1 [56];
  allocator<char> local_69 [33];
  undefined8 local_48;
  undefined8 uStack_40;
  ggml_context *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 *local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ggml_time_init();
  if (local_8 == 4) {
    local_28 = 0;
    uStack_20 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_30 = ggml_init(in_stack_00001808);
    ggml_free(in_stack_fffffffffffffee0);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_69);
    __a = (allocator<char> *)local_10[2];
    __s = local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
    std::allocator<char>::~allocator(local_a1);
    atoi((char *)local_10[3]);
    iVar2 = ggml_time_us();
    iVar3 = ggml_time_us();
    bVar1 = llama_model_quantize(in_stack_000006e8,in_stack_000006e0,in_stack_000006dc);
    __stream = _stderr;
    if (bVar1) {
      iVar5 = ggml_time_us();
      pgVar6 = (ggml_context *)ggml_time_us();
      in_stack_fffffffffffffee0 = pgVar6;
      printf("\n");
      printf("%s: quantize time = %8.2f ms\n",SUB84((double)((float)(iVar5 - iVar3) / 1000.0),0),
             "main");
      printf("%s:    total time = %8.2f ms\n",
             SUB84((double)((float)((long)pgVar6 - iVar2) / 1000.0),0),"main");
    }
    else {
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffee0);
      fprintf(__stream,"%s: failed to quantize model from \'%s\'\n","main",pcVar4);
    }
    local_4 = (uint)!bVar1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffee0);
  }
  else {
    fprintf(_stderr,"usage: %s model-f32.bin model-quant.bin type\n",*local_10);
    fprintf(_stderr,"  type = 2 - q4_0\n");
    fprintf(_stderr,"  type = 3 - q4_1\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();
    if (argc != 4) {
        fprintf(stderr, "usage: %s model-f32.bin model-quant.bin type\n", argv[0]);
        fprintf(stderr, "  type = 2 - q4_0\n");
        fprintf(stderr, "  type = 3 - q4_1\n");
        return 1;
    }

    // needed to initialize f16 tables
    {
        struct ggml_init_params params = { 0, NULL };
        struct ggml_context * ctx = ggml_init(params);
        ggml_free(ctx);
    }

    const std::string fname_inp = argv[1];
    const std::string fname_out = argv[2];

    const int itype = atoi(argv[3]);

    const int64_t t_main_start_us = ggml_time_us();

    int64_t t_quantize_us = 0;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!llama_model_quantize(fname_inp, fname_out, itype)) {
            fprintf(stderr, "%s: failed to quantize model from '%s'\n", __func__, fname_inp.c_str());
            return 1;
        }

        t_quantize_us = ggml_time_us() - t_start_us;
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n");
        printf("%s: quantize time = %8.2f ms\n", __func__, t_quantize_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    return 0;
}